

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O0

StackSym * __thiscall StackSym::CloneDef(StackSym *this,Func *func)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  Cloner *pCVar4;
  undefined4 *puVar5;
  HashTable<StackSym_*,_Memory::ArenaAllocator> *pHVar6;
  StackSym **ppSVar7;
  StackSym **entry;
  StackSym *newSym;
  Cloner *cloner;
  Func *func_local;
  StackSym *this_local;
  
  pCVar4 = Func::GetCloner(func);
  entry = (StackSym **)0x0;
  if (pCVar4 == (Cloner *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x1d7,"(cloner)","Use Func::BeginClone to initialize cloner");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_local = this;
  if (((*(uint *)&this->field_0x18 & 1) != 0) &&
     ((((OVar1 = ((this->field_5).m_instrDef)->m_opcode, OVar1 == StartCall || (OVar1 == ArgOut_A))
       || (OVar1 == ArgOut_A_InlineBuiltIn)) ||
      (((OVar1 == ArgOut_A_Dynamic || (OVar1 == ArgOut_A_SpreadArg)) || (OVar1 == InlineeMetaArg))))
     )) {
    if (pCVar4->symMap == (HashTable<StackSym_*,_Memory::ArenaAllocator> *)0x0) {
      pHVar6 = HashTable<StackSym_*,_Memory::ArenaAllocator>::New
                         (&pCVar4->alloc->super_ArenaAllocator,7);
      pCVar4->symMap = pHVar6;
    }
    else {
      ppSVar7 = HashTable<StackSym_*,_Memory::ArenaAllocator>::Get
                          (pCVar4->symMap,(this->super_Sym).m_id);
      if (ppSVar7 != (StackSym **)0x0) {
        entry = (StackSym **)*ppSVar7;
      }
    }
    if (entry == (StackSym **)0x0) {
      entry = (StackSym **)New(func);
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xfffffff7 |
           (*(uint *)&this->field_0x18 >> 3 & 1) << 3;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xffffffef |
           (*(uint *)&this->field_0x18 >> 4 & 1) << 4;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xffffffdf |
           (*(uint *)&this->field_0x18 >> 5 & 1) << 5;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xffefffff |
           (*(uint *)&this->field_0x18 >> 0x14 & 1) << 0x14;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xffdfffff |
           (*(uint *)&this->field_0x18 >> 0x15 & 1) << 0x15;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xffbfffff |
           (*(uint *)&this->field_0x18 >> 0x16 & 1) << 0x16;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xff7fffff |
           (*(uint *)&this->field_0x18 >> 0x17 & 1) << 0x17;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xfdffffff |
           (*(uint *)&this->field_0x18 >> 0x19 & 1) << 0x19;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xfeffffff |
           (*(uint *)&this->field_0x18 >> 0x18 & 1) << 0x18;
      *(undefined2 *)&(((StackSym *)entry)->super_Sym).field_0x16 =
           *(undefined2 *)&(this->super_Sym).field_0x16;
      ((StackSym *)entry)->m_argPosition = this->m_argPosition;
      ((StackSym *)entry)->m_offset = this->m_offset;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xffffefff |
           (*(uint *)&this->field_0x18 >> 0xc & 1) << 0xc;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xffffbfff |
           (*(uint *)&this->field_0x18 >> 0xe & 1) << 0xe;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xf7ffffff |
           (*(uint *)&this->field_0x18 >> 0x1b & 1) << 0x1b;
      *(uint *)&((StackSym *)entry)->field_0x18 =
           *(uint *)&((StackSym *)entry)->field_0x18 & 0xefffffff |
           (*(uint *)&this->field_0x18 >> 0x1c & 1) << 0x1c;
      ((StackSym *)entry)->m_type = this->m_type;
      CopySymAttrs((StackSym *)entry,this);
      ((StackSym *)entry)->m_equivNext = (StackSym *)entry;
      HashTable<StackSym_*,_Memory::ArenaAllocator>::FindOrInsert
                (pCVar4->symMap,(StackSym *)entry,(this->super_Sym).m_id);
    }
    this_local = (StackSym *)entry;
  }
  return this_local;
}

Assistant:

StackSym *
StackSym::CloneDef(Func *func)
{
    Cloner * cloner = func->GetCloner();
    StackSym *  newSym = nullptr;

    AssertMsg(cloner, "Use Func::BeginClone to initialize cloner");

    if (!this->m_isSingleDef)
    {
        return this;
    }

    switch (this->m_instrDef->m_opcode)
    {
        // Note: we were cloning single-def load constant instr's, but couldn't guarantee
        // that we were cloning all the uses.
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::ArgOut_A_SpreadArg:
    case Js::OpCode::StartCall:
    case Js::OpCode::InlineeMetaArg:
        // Go ahead and clone: we need a single-def sym.
        // Arg/StartCall trees must be single-def.
        // Uses of int-const syms may need to find their defining instr's.
        break;
    default:
        return this;
    }

    if (cloner->symMap == nullptr)
    {
        cloner->symMap = HashTable<StackSym*>::New(cloner->alloc, 7);
    }
    else
    {
        StackSym **entry = cloner->symMap->Get(m_id);
        if (entry)
        {
            newSym = *entry;
        }
    }
    if (newSym == nullptr)
    {
        // NOTE: We don't care about the bytecode register information for cloned symbol
        // As those are the float sym that we will convert back to Var before jumping back
        // to the slow path's bailout.  The bailout can just track the original symbol.
        newSym = StackSym::New(func);
        newSym->m_isConst = m_isConst;
        newSym->m_isIntConst = m_isIntConst;
        newSym->m_isTaggableIntConst = m_isTaggableIntConst;
        newSym->m_isArgSlotSym = m_isArgSlotSym;
        newSym->m_isArgSlotRegSym = m_isArgSlotRegSym;
        newSym->m_isParamSym = m_isParamSym;
        newSym->m_isImplicitParamSym = m_isImplicitParamSym;
        newSym->m_isArgCaptured = m_isArgCaptured;
        newSym->m_isBailOutReferenced = m_isBailOutReferenced;
        newSym->m_slotNum = m_slotNum;

#if defined(_M_X64)
        newSym->m_argPosition = m_argPosition;
#endif

        newSym->m_offset = m_offset;
        newSym->m_allocated = m_allocated;
        newSym->m_isInlinedArgSlot = m_isInlinedArgSlot;
        newSym->m_isCatchObjectSym = m_isCatchObjectSym;
        newSym->m_isClosureSym = m_isClosureSym;
        newSym->m_type = m_type;

        newSym->CopySymAttrs(this);

        // NOTE: It is not clear what the right thing to do is here...
        newSym->m_equivNext = newSym;
        cloner->symMap->FindOrInsert(newSym, m_id);
    }

    return newSym;
}